

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_example.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  type tVar2;
  __node_base _Var3;
  _Hash_node_base *p_Var4;
  undefined1 auVar5 [16];
  long *plVar6;
  ostream *poVar7;
  ulong uVar8;
  _Node_iterator_base<int,_false> __it;
  __hashtable *__h;
  char *pcVar9;
  long lVar10;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> my_integers_set;
  int integers [6];
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_78;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_78._M_buckets = &local_78._M_single_bucket;
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket = (__node_base_ptr)0x0;
  local_38 = 0x100000002;
  uStack_30 = 0x200000003;
  local_28 = 0x100000003;
  lVar10 = 0;
  do {
    local_40 = (undefined1 *)&local_78;
    std::
    _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
              ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_78,(long)&local_38 + lVar10,&local_40);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Elements of set\n",0x10)
  ;
  for (_Var3._M_nxt = local_78._M_before_begin._M_nxt; _Var3._M_nxt != (_Hash_node_base *)0x0;
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt) {
    plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&_Var3._M_nxt[1]._M_nxt)
    ;
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Set size: ",10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_78._M_bucket_count;
  uVar8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar5,0);
  lVar10 = 0x18;
  pcVar9 = "Element not found in set";
  if (local_78._M_buckets[uVar8 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var4 = local_78._M_buckets[uVar8 & 0xffffffff]->_M_nxt;
    iVar1 = *(int *)&p_Var4[1]._M_nxt;
    while (iVar1 != 5) {
      p_Var4 = p_Var4->_M_nxt;
      if ((p_Var4 == (_Hash_node_base *)0x0) ||
         (iVar1 = *(int *)&p_Var4[1]._M_nxt, (ulong)(long)iVar1 % local_78._M_bucket_count != uVar8)
         ) goto LAB_0010242f;
    }
    pcVar9 = "Element found in set";
    lVar10 = 0x14;
  }
LAB_0010242f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  if (local_78._M_buckets[local_78._M_bucket_count != 1] != (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)local_78._M_buckets[local_78._M_bucket_count != 1]->_M_nxt;
    tVar2 = ((__it._M_cur)->super__Hash_node_value<int,_false>).super__Hash_node_value_base<int>.
            _M_storage._M_storage;
    do {
      if (tVar2 == (type)0x1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Element found in set",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
        std::ostream::put('p');
        std::ostream::flush();
        goto LAB_0010253f;
      }
      __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
    } while ((__it._M_cur != (__node_type *)0x0) &&
            (tVar2 = ((__it._M_cur)->super__Hash_node_value<int,_false>).
                     super__Hash_node_value_base<int>._M_storage._M_storage,
            (ulong)(long)(int)tVar2 % local_78._M_bucket_count ==
            (ulong)(local_78._M_bucket_count != 1)));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Element not found in set",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  __it._M_cur = (__node_type *)0x0;
LAB_0010253f:
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::erase(&local_78,(const_iterator)__it._M_cur);
  lVar10 = 0x18;
  pcVar9 = "Element not found in set";
  if (local_78._M_buckets[local_78._M_bucket_count != 1] != (__node_base_ptr)0x0) {
    p_Var4 = local_78._M_buckets[local_78._M_bucket_count != 1]->_M_nxt;
    iVar1 = *(int *)&p_Var4[1]._M_nxt;
    while (iVar1 != 1) {
      p_Var4 = p_Var4->_M_nxt;
      if ((p_Var4 == (_Hash_node_base *)0x0) ||
         (iVar1 = *(int *)&p_Var4[1]._M_nxt,
         (ulong)(long)iVar1 % local_78._M_bucket_count != (ulong)(local_78._M_bucket_count != 1)))
      goto LAB_001025aa;
    }
    pcVar9 = "Element found in set";
    lVar10 = 0x14;
  }
LAB_001025aa:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Elements of set\n",0x10)
  ;
  for (_Var3._M_nxt = local_78._M_before_begin._M_nxt; _Var3._M_nxt != (_Hash_node_base *)0x0;
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt) {
    plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&_Var3._M_nxt[1]._M_nxt)
    ;
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Set size: ",10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_78);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Declaration of a unordered_set is very similar to a vector.
  std::unordered_set<int> my_integers_set;
  // Let's insert elements into the set from an array.
  int integers[] = {2, 1, 3, 2, 3, 1};
  // A neat trick to get the size of arrays.
  const int kArraySize = sizeof(integers) / sizeof(integers[0]);
  for (int i = 0; i < kArraySize; ++i) {
    my_integers_set.insert(integers[i]);
  }
  // Let's print out the contents of set.
  std::cout << "Elements of set\n";
  for (int element : my_integers_set) {
    std::cout << element << std::endl;
  }
  std::cout << "Set size: " << my_integers_set.size() << std::endl;
  // Sets are useful to search elements. However, it requires knowledge of
  // iterators. See iteratorsexample.cc to see more examples about iterators.
  // Say we want to see if the number 5 is in the set.
  // The set returns an iterator different than std::set::end() when the element
  // is present in the set, and returns std::set::end() otherwise.
  // Let's search for an element not in the set.
  std::unordered_set<int>::iterator iterator = my_integers_set.find(5);
  if (iterator == my_integers_set.end()) {
    std::cout << "Element not found in set" << std::endl;
  } else {
    std::cout << "Element found in set" << std::endl;
  }
  // Let's search for an element in the set.
  iterator = my_integers_set.find(1);
  if (iterator == my_integers_set.end()) {
    std::cout << "Element not found in set" << std::endl;
  } else {
    std::cout << "Element found in set" << std::endl;
  }
  // Note that the elements are sorted. This is because the set exploits
  // the ordering property to organize the elements and remove duplicates.
  // To erase elements we need to understand what iterators are, see
  // iterators_example.cc for explanation and illustration of iterators.
  // To erase one element from the set, we need to obtain an iterator first to
  // that element and pass the iterator as the element to erase.
  my_integers_set.erase(iterator);
  // Let's verify that it erased the element, in this case will erase 1 since
  // iterator is "pointing" to it.
  iterator = my_integers_set.find(1);
  if (iterator == my_integers_set.end()) {
    std::cout << "Element not found in set" << std::endl;
  } else {
    std::cout << "Element found in set" << std::endl;
  }
  // Let's print out the contents of set.
  std::cout << "Elements of set\n";
  for (int element : my_integers_set) {
    std::cout << element << std::endl;
  }
  std::cout << "Set size: " << my_integers_set.size() << std::endl;
  return 0;
}